

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix2d>
          (GeomPrimvar *this,double timecode,matrix2d *dest,TimeSampleInterpolationType interp,
          string *err)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  bool bVar3;
  matrix2d value;
  undefined1 local_c0 [8];
  string local_b8;
  undefined4 local_94;
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = (undefined1  [8])timecode;
  if (dest == (matrix2d *)0x0) {
joined_r0x001c3066:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args = err;
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar3 = false;
      }
      else {
        uVar2 = (*pvVar1->type_id)();
        bVar3 = uVar2 == 4;
      }
      if ((bVar3) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001c3066;
    }
    this_00 = &this->_attr;
    uVar2 = Attribute::type_id(this_00);
    bVar3 = IsSupportedGeomPrimvarType(uVar2);
    if (bVar3) {
      local_70._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      local_70._M_string_length = 0;
      local_70.field_2._M_allocated_capacity = 0;
      local_70.field_2._8_8_ = 1.0;
      bVar3 = Attribute::get<tinyusdz::value::matrix2d>
                        (this_00,(double)local_c0,(matrix2d *)&local_70,interp);
      if (bVar3) {
        dest->m[1][0] = (double)local_70.field_2._M_allocated_capacity;
        dest->m[1][1] = (double)local_70.field_2._8_8_;
        dest->m[0][0] = (double)local_70._M_dataplus._M_p;
        dest->m[0][1] = (double)local_70._M_string_length;
        return bVar3;
      }
      if (err == (string *)0x0) {
        return bVar3;
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c0 + 8),
                 "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                 ,"");
      local_94 = 0x36;
      Attribute::type_name_abi_cxx11_(&local_50,this_00);
      fmt::format<double,unsigned_int,std::__cxx11::string>
                (&local_90,(fmt *)(local_c0 + 8),(string *)local_c0,(double *)&local_94,
                 (uint *)&local_50,in_R9);
      std::__cxx11::string::_M_append((char *)err,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return bVar3;
      }
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      return bVar3;
    }
    if (err != (string *)0x0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unsupported type for GeomPrimvar. type = `{}`","");
      Attribute::type_name_abi_cxx11_((string *)(local_c0 + 8),this_00);
      fmt::format<std::__cxx11::string>(&local_70,(fmt *)&local_90,(string *)(local_c0 + 8),args);
      std::__cxx11::string::_M_append((char *)err,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}